

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiContext *pIVar6;
  ImVec2 IVar7;
  
  pIVar6 = GImGui;
  FocusWindow(window);
  SetActiveID(window->MoveId,window);
  pIVar6->NavDisableHighlight = true;
  IVar1 = (pIVar6->IO).MousePos;
  IVar2 = window->RootWindow->Pos;
  IVar7.x = IVar1.x - IVar2.x;
  IVar7.y = IVar1.y - IVar2.y;
  pIVar6->ActiveIdClickOffset = IVar7;
  if ((window->Flags & 4) == 0) {
    bVar5 = true;
    bVar4 = true;
    if ((window->RootWindow->Flags & 4) == 0) goto LAB_001528d1;
  }
  bVar5 = false;
  bVar4 = false;
LAB_001528d1:
  if (((window->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
      (pIVar3 = window->DockNodeAsHost->VisibleWindow, pIVar3 != (ImGuiWindow *)0x0)) &&
     (bVar4 = bVar5, (pIVar3->Flags & 4) != 0)) {
    bVar4 = false;
  }
  if (bVar4) {
    pIVar6->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MousePos - window->RootWindow->Pos;

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindow->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (ImGuiDockNode* node = window->DockNodeAsHost)
        if (node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove))
            can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}